

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

void set_iterate(set s,set_cb_iterate iterate_cb,set_cb_iterate_args args)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bucket pbVar5;
  
  if (((s != (set)0x0) && (iterate_cb != (set_cb_iterate)0x0)) && (s->buckets != (bucket)0x0)) {
    for (uVar2 = 0; uVar2 < s->capacity; uVar2 = uVar2 + 1) {
      if ((s->buckets[uVar2].pairs != (pair)0x0) &&
         (pbVar5 = s->buckets + uVar2, pbVar5->count != 0)) {
        uVar4 = 0xffffffffffffffff;
        lVar3 = 8;
        while (uVar4 = uVar4 + 1, uVar4 < pbVar5->count) {
          iVar1 = (*iterate_cb)(s,*(set_key *)((long)pbVar5->pairs + lVar3 + -8),
                                *(set_value *)((long)&pbVar5->pairs->key + lVar3),args);
          lVar3 = lVar3 + 0x10;
          if (iVar1 != 0) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void set_iterate(set s, set_cb_iterate iterate_cb, set_cb_iterate_args args)
{
	if (s != NULL && s->buckets != NULL && iterate_cb != NULL)
	{
		size_t bucket_iterator;

		for (bucket_iterator = 0; bucket_iterator < s->capacity; ++bucket_iterator)
		{
			bucket b = &s->buckets[bucket_iterator];

			if (b->pairs != NULL && b->count > 0)
			{
				size_t pair_iterator;

				for (pair_iterator = 0; pair_iterator < b->count; ++pair_iterator)
				{
					pair p = &b->pairs[pair_iterator];

					if (iterate_cb(s, p->key, p->value, args) != 0)
					{
						return;
					}
				}
			}
		}
	}
}